

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O3

void __thiscall
QDirPrivate::QDirPrivate
          (QDirPrivate *this,QString *path,QStringList *nameFilters_,SortFlags sort_,
          Filters filters_)

{
  QString *pQVar1;
  Data *pDVar2;
  qsizetype qVar3;
  QString *pQVar4;
  QString *pQVar5;
  undefined4 in_register_0000000c;
  storage_type *psVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QString local_80;
  QArrayDataPointer<QString> local_68;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  psVar6 = (storage_type *)
           CONCAT44(in_register_0000000c,
                    sort_.super_QFlagsStorageHelper<QDir::SortFlag,_4>.
                    super_QFlagsStorage<QDir::SortFlag>.i);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  pDVar2 = (nameFilters_->d).d;
  (this->nameFilters).d.d = pDVar2;
  (this->nameFilters).d.ptr = (nameFilters_->d).ptr;
  (this->nameFilters).d.size = (nameFilters_->d).size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.i =
       (Int)sort_.super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.i
  ;
  (this->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.i =
       (Int)filters_.super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.i;
  (this->fileEngine)._M_t.
  super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
  super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
  super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl = (QAbstractFileEngine *)0x0;
  QFileSystemEntry::QFileSystemEntry(&this->dirEntry);
  (this->fileCache).fileInfos.d.ptr = (QFileInfo *)0x0;
  (this->fileCache).fileInfos.d.size = 0;
  (this->fileCache).files.d.size = 0;
  (this->fileCache).fileInfos.d.d = (Data *)0x0;
  (this->fileCache).files.d.d = (Data *)0x0;
  (this->fileCache).files.d.ptr = (QString *)0x0;
  (this->fileCache).fileListsInitialized._M_base._M_i = false;
  QFileSystemEntry::QFileSystemEntry(&(this->fileCache).absoluteDirEntry);
  (this->fileCache).metaData.knownFlagsMask =
       (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
  (this->fileCache).metaData.entryFlags =
       (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
  (this->fileCache).metaData.size_ = -1;
  (this->fileCache).metaData.accessTime_ = 0;
  (this->fileCache).metaData.birthTime_ = 0;
  (this->fileCache).metaData.metadataChangeTime_ = 0;
  (this->fileCache).metaData.modificationTime_ = 0;
  (this->fileCache).metaData.userId_ = 0xfffffffe;
  (this->fileCache).metaData.groupId_ = 0xfffffffe;
  lVar8 = (path->d).size;
  if (lVar8 == 0) {
    ba.m_data = psVar6;
    ba.m_size = (qsizetype)".";
    QString::fromLatin1((QString *)&local_48,(QString *)0x1,ba);
  }
  else {
    local_48.d = (Data *)(path->d).d;
    local_48.ptr = (QString *)(path->d).ptr;
    local_48.size = lVar8;
    if ((QArrayData *)local_48.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_48.d)->ref_)->ref_)._q_value.super___atomic_base<int>.
      _M_i = (((QArrayData *)&((QArrayData *)local_48.d)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  setPath(this,(QString *)&local_48);
  if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar5 = (this->nameFilters).d.ptr;
  lVar8 = (this->nameFilters).d.size;
  pQVar1 = pQVar5 + lVar8;
  if (0 < lVar8 >> 2) {
    lVar7 = (lVar8 >> 2) + 1;
    lVar8 = lVar8 * 0x18;
    pQVar4 = pQVar5 + 2;
    do {
      pQVar5 = pQVar4;
      if (pQVar5[-2].d.size != 0) {
        pQVar5 = pQVar5 + -2;
        goto LAB_00134e0c;
      }
      if (pQVar5[-1].d.size != 0) {
        pQVar5 = pQVar5 + -1;
        goto LAB_00134e0c;
      }
      if ((pQVar5->d).size != 0) goto LAB_00134e0c;
      if (pQVar5[1].d.size != 0) {
        pQVar5 = pQVar5 + 1;
        goto LAB_00134e0c;
      }
      lVar7 = lVar7 + -1;
      lVar8 = lVar8 + -0x60;
      pQVar4 = pQVar5 + 4;
    } while (1 < lVar7);
    lVar8 = (lVar8 >> 3) * -0x5555555555555555;
    pQVar5 = pQVar5 + 2;
  }
  if (lVar8 == 1) {
LAB_00134df1:
    if ((pQVar5->d).size == 0) {
      pQVar5 = pQVar1;
    }
LAB_00134e0c:
    if (pQVar5 != pQVar1) goto LAB_00134eb3;
  }
  else {
    if (lVar8 == 2) {
LAB_00134de6:
      if ((pQVar5->d).size == 0) {
        pQVar5 = pQVar5 + 1;
        goto LAB_00134df1;
      }
      goto LAB_00134e0c;
    }
    if (lVar8 == 3) {
      if ((pQVar5->d).size == 0) {
        pQVar5 = pQVar5 + 1;
        goto LAB_00134de6;
      }
      goto LAB_00134e0c;
    }
  }
  ba_00.m_data = (storage_type *)pQVar1;
  ba_00.m_size = (qsizetype)"*";
  QString::fromLatin1(&local_80,(QString *)0x1,ba_00);
  local_68.size = 0;
  local_68.d = (Data *)0x0;
  local_68.ptr = (QString *)0x0;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)&local_68,0,&local_80);
  QList<QString>::end((QList<QString> *)&local_68);
  qVar3 = local_68.size;
  pQVar1 = local_68.ptr;
  pDVar2 = local_68.d;
  local_68.size = 0;
  local_68.d = (Data *)0x0;
  local_68.ptr = (QString *)0x0;
  local_48.d = (this->nameFilters).d.d;
  local_48.ptr = (this->nameFilters).d.ptr;
  (this->nameFilters).d.d = pDVar2;
  (this->nameFilters).d.ptr = pQVar1;
  local_48.size = (this->nameFilters).d.size;
  (this->nameFilters).d.size = qVar3;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
  if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00134eb3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QDirPrivate::QDirPrivate(const QString &path, const QStringList &nameFilters_,
                         QDir::SortFlags sort_, QDir::Filters filters_)
    : QSharedData(), nameFilters(nameFilters_), sort(sort_), filters(filters_)
{
    setPath(path.isEmpty() ? QString::fromLatin1(".") : path);

    auto isEmpty = [](const auto &e) { return e.isEmpty(); };
    const bool empty = std::all_of(nameFilters.cbegin(), nameFilters.cend(), isEmpty);
    if (empty)
        nameFilters = QStringList(QString::fromLatin1("*"));
}